

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void expand_cmp_i64(TCGContext_conflict9 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t bofs,
                   uint32_t oprsz,TCGCond cond)

{
  TCGv_i64 arg;
  TCGv_i64 arg_00;
  uint local_3c;
  uint32_t i;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGCond cond_local;
  uint32_t oprsz_local;
  uint32_t bofs_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  arg = tcg_temp_new_i64(tcg_ctx);
  arg_00 = tcg_temp_new_i64(tcg_ctx);
  for (local_3c = 0; local_3c < oprsz; local_3c = local_3c + 8) {
    tcg_gen_ld_i64_tricore(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(aofs + local_3c));
    tcg_gen_ld_i64_tricore(tcg_ctx,arg_00,tcg_ctx->cpu_env,(ulong)(bofs + local_3c));
    tcg_gen_setcond_i64_tricore(tcg_ctx,cond,arg,arg,arg_00);
    tcg_gen_neg_i64(tcg_ctx,arg,arg);
    tcg_gen_st_i64_tricore(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(dofs + local_3c));
  }
  tcg_temp_free_i64(tcg_ctx,arg_00);
  tcg_temp_free_i64(tcg_ctx,arg);
  return;
}

Assistant:

static void expand_cmp_i64(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t bofs,
                           uint32_t oprsz, TCGCond cond)
{
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    uint32_t i;

    for (i = 0; i < oprsz; i += 8) {
        tcg_gen_ld_i64(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        tcg_gen_ld_i64(tcg_ctx, t1, tcg_ctx->cpu_env, bofs + i);
        tcg_gen_setcond_i64(tcg_ctx,cond, t0, t0, t1);
        tcg_gen_neg_i64(tcg_ctx,t0, t0);
        tcg_gen_st_i64(tcg_ctx, t0, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t0);
}